

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O2

void Bac_ManMarkNodesAbc(Bac_Man_t *p,Abc_Ntk_t *pNtk)

{
  int *piVar1;
  uint uVar2;
  int *piVar3;
  int iVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  
  if ((p->vBuf2LeafNtk).nSize != pNtk->nBarBufs2) {
    __assert_fail("Vec_IntSize(&p->vBuf2LeafNtk) == pNtk->nBarBufs2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBlast.c"
                  ,0x1be,"void Bac_ManMarkNodesAbc(Bac_Man_t *, Abc_Ntk_t *)");
  }
  for (iVar7 = 0; iVar7 < pNtk->vPis->nSize; iVar7 = iVar7 + 1) {
    pAVar5 = Abc_NtkPi(pNtk,iVar7);
    (pAVar5->field_6).iTemp = 1;
  }
  iVar8 = 0;
  iVar7 = 0;
  do {
    if (pNtk->vObjs->nSize <= iVar8) {
      iVar8 = 0;
      do {
        if (pNtk->vPos->nSize <= iVar8) {
          if (iVar7 == pNtk->nBarBufs2) {
            return;
          }
          __assert_fail("Count == pNtk->nBarBufs2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBlast.c"
                        ,0x1d3,"void Bac_ManMarkNodesAbc(Bac_Man_t *, Abc_Ntk_t *)");
        }
        pAVar6 = Abc_NtkPo(pNtk,iVar8);
        pAVar5 = (Abc_Obj_t *)pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanins).pArray];
        iVar4 = Abc_NodeIsSeriousGate(pAVar5);
        if (iVar4 != 0) {
          if ((pAVar5->field_6).iTemp != 1) {
            __assert_fail("Abc_ObjFanin0(pObj)->iTemp == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBlast.c"
                          ,0x1d0,"void Bac_ManMarkNodesAbc(Bac_Man_t *, Abc_Ntk_t *)");
          }
          (pAVar6->field_6).iTemp = 1;
        }
        iVar8 = iVar8 + 1;
      } while( true );
    }
    pAVar5 = Abc_NtkObj(pNtk,iVar8);
    if ((pAVar5 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar5->field_0x14 & 0xf) == 7)) {
      iVar4 = Abc_ObjIsBarBuf(pAVar5);
      if (iVar4 == 0) {
        iVar4 = Abc_NodeIsSeriousGate(pAVar5);
        if (iVar4 != 0) {
          piVar3 = (pAVar5->vFanins).pArray;
          iVar4 = *(int *)((long)pAVar5->pNtk->vObjs->pArray[*piVar3] + 0x40);
          (pAVar5->field_6).iTemp = iVar4;
          uVar2 = (pAVar5->vFanins).nSize;
          uVar9 = (ulong)uVar2;
          if ((int)uVar2 < 1) {
            uVar9 = 0;
          }
          uVar10 = 0;
          while (uVar9 != uVar10) {
            piVar1 = piVar3 + uVar10;
            uVar10 = uVar10 + 1;
            if (iVar4 != *(int *)((long)pAVar5->pNtk->vObjs->pArray[*piVar1] + 0x40)) {
              __assert_fail("pObj->iTemp == pFanin->iTemp",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBlast.c"
                            ,0x1c9,"void Bac_ManMarkNodesAbc(Bac_Man_t *, Abc_Ntk_t *)");
            }
          }
        }
      }
      else {
        iVar4 = Vec_IntEntry(&p->vBuf2LeafNtk,iVar7);
        (pAVar5->field_6).iTemp = iVar4;
        iVar7 = iVar7 + 1;
      }
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

void Bac_ManMarkNodesAbc( Bac_Man_t * p, Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pFanin; int i, k, Count = 0;
    assert( Vec_IntSize(&p->vBuf2LeafNtk) == pNtk->nBarBufs2 );
    Abc_NtkForEachPi( pNtk, pObj, i )
        pObj->iTemp = 1;
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( Abc_ObjIsBarBuf(pObj) )
            pObj->iTemp = Vec_IntEntry( &p->vBuf2LeafNtk, Count++ );
        else if ( Abc_NodeIsSeriousGate(pObj) )
        {
            pObj->iTemp = Abc_ObjFanin0(pObj)->iTemp;
            Abc_ObjForEachFanin( pObj, pFanin, k )
                assert( pObj->iTemp == pFanin->iTemp );
        }
    }
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        if ( !Abc_NodeIsSeriousGate(Abc_ObjFanin0(pObj)) )
            continue;
        assert( Abc_ObjFanin0(pObj)->iTemp == 1 );
        pObj->iTemp = Abc_ObjFanin0(pObj)->iTemp;
    }
    assert( Count == pNtk->nBarBufs2 );
}